

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhsum.c
# Opt level: O0

void XSUM_benchHash(hashFunction h,char *hName,int testID,void *buffer,size_t bufferSize)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined4 uVar3;
  int iVar4;
  clock_t cVar5;
  clock_t cVar6;
  clock_t cVar7;
  undefined8 in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  code *in_RDI;
  long in_R8;
  double dVar8;
  undefined4 uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double nbh_perSecond_1;
  double nbh_perSecond;
  double ticksPerHash;
  clock_t nbTicks;
  XSUM_U32 u;
  clock_t cStart;
  XSUM_U32 r;
  double fastestH;
  uint nbIterations;
  uint iterationNb;
  XSUM_U32 nbh_perIteration;
  double local_78;
  double local_70;
  uint local_54;
  int local_44;
  double local_40;
  uint local_30;
  uint local_2c;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_R8 + 1;
  local_2c = SUB164((ZEXT416(0) << 0x40 | ZEXT816(0x12c00000)) / auVar1,0) + 1;
  uVar2 = g_nbIterations + ((g_nbIterations != 0 ^ 0xffU) & 1);
  local_40 = 100000000.0;
  XSUM_logVerbose(2,"\r%80s\r","");
  local_30 = 1;
  do {
    uVar3 = (undefined4)in_R8;
    uVar11 = (undefined4)((ulong)in_R8 >> 0x20);
    if (uVar2 < local_30) {
      auVar10._8_4_ = uVar11;
      auVar10._0_8_ = in_R8;
      auVar10._12_4_ = 0x45300000;
      XSUM_logVerbose((int)(1.0 / local_40),
                      (char *)((((auVar10._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0)) /
                               1048576.0) / local_40),1,
                      "%2i#%-*.*s : %10u -> %8.0f it/s (%7.1f MB/s) \n",(ulong)in_EDX,0x1d,0x1d,
                      in_RSI,uVar3);
      if (XSUM_logLevel < 1) {
        XSUM_logVerbose(0,"%u, ",(long)(1.0 / local_40) & 0xffffffff);
      }
      return;
    }
    local_44 = 0;
    XSUM_logVerbose(2,"%2u-%-*.*s : %10u ->\r",(ulong)local_30,0x1d,0x1d,in_RSI,uVar3);
    cVar5 = clock();
    do {
      cVar6 = clock();
    } while (cVar6 == cVar5);
    clock();
    for (local_54 = 0; local_54 < local_2c; local_54 = local_54 + 1) {
      iVar4 = (*in_RDI)(in_RCX,in_R8,local_54);
      local_44 = iVar4 + local_44;
    }
    if (local_44 == 0) {
      XSUM_logVerbose(3,".\r");
    }
    cVar7 = XSUM_clockSpan(0x1036c3);
    dVar8 = ((double)cVar7 / 1000000.0) / (double)local_2c;
    if (cVar7 < 500000) {
      if (cVar7 == 0) {
        local_2c = local_2c * 100;
      }
      else {
        local_70 = 1.0 / dVar8 + 1.0;
        if (4194304000.0 < local_70) {
          local_70 = 4194304000.0;
        }
        local_2c = (uint)(long)local_70;
      }
      if (g_nbIterations == 0) goto LAB_00103774;
      local_30 = local_30 - 1;
    }
    else {
LAB_00103774:
      if (dVar8 < local_40) {
        local_40 = dVar8;
      }
      if (0.0 < local_40) {
        auVar9._8_4_ = uVar11;
        auVar9._0_8_ = in_R8;
        auVar9._12_4_ = 0x45300000;
        XSUM_logVerbose((int)(1.0 / local_40),
                        (char *)((((auVar9._8_8_ - 1.9342813113834067e+25) +
                                  ((double)CONCAT44(0x43300000,uVar3) - 4503599627370496.0)) /
                                 1048576.0) / local_40),2,
                        "%2u-%-*.*s : %10u -> %8.0f it/s (%7.1f MB/s) \r",(ulong)local_30,0x1d,0x1d,
                        in_RSI,uVar3);
      }
      local_78 = 1.0 / local_40 + 1.0;
      if (4194304000.0 < local_78) {
        local_78 = 4194304000.0;
      }
      local_2c = (uint)(long)local_78;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static void XSUM_benchHash(hashFunction h, const char* hName, int testID,
                          const void* buffer, size_t bufferSize)
{
    XSUM_U32 nbh_perIteration = (XSUM_U32)((300 MB) / (bufferSize+1)) + 1;  /* first iteration conservatively aims for 300 MB/s */
    unsigned iterationNb, nbIterations = g_nbIterations + !g_nbIterations /* min 1 */;
    double fastestH = 100000000.;
    assert(HASHNAME_MAX > 2);
    XSUM_logVerbose(2, "\r%80s\r", "");       /* Clean display line */

    for (iterationNb = 1; iterationNb <= nbIterations; iterationNb++) {
        XSUM_U32 r=0;
        clock_t cStart;

        XSUM_logVerbose(2, "%2u-%-*.*s : %10u ->\r",
                        iterationNb,
                        HASHNAME_MAX, HASHNAME_MAX, hName,
                        (unsigned)bufferSize);
        cStart = clock();
        while (clock() == cStart);   /* starts clock() at its exact beginning */
        cStart = clock();

        {   XSUM_U32 u;
            for (u=0; u<nbh_perIteration; u++)
                r += h(buffer, bufferSize, u);
        }
        if (r==0) XSUM_logVerbose(3,".\r");  /* do something with r to defeat compiler "optimizing" hash away */

        {   clock_t const nbTicks = XSUM_clockSpan(cStart);
            double const ticksPerHash = ((double)nbTicks / TIMELOOP) / nbh_perIteration;
            /*
             * clock() is the only decent portable timer, but it isn't very
             * precise.
             *
             * Sometimes, this lack of precision is enough that the benchmark
             * finishes before there are enough ticks to get a meaningful result.
             *
             * For example, on a Core 2 Duo (without any sort of Turbo Boost),
             * the imprecise timer caused peculiar results like so:
             *
             *    XXH3_64b                   4800.0 MB/s // conveniently even
             *    XXH3_64b unaligned         4800.0 MB/s
             *    XXH3_64b seeded            9600.0 MB/s // magical 2x speedup?!
             *    XXH3_64b seeded unaligned  4800.0 MB/s
             *
             * If we sense a suspiciously low number of ticks, we increase the
             * iterations until we can get something meaningful.
             */
            if (nbTicks < TIMELOOP_MIN) {
                /* Not enough time spent in benchmarking, risk of rounding bias */
                if (nbTicks == 0) { /* faster than resolution timer */
                    nbh_perIteration *= 100;
                } else {
                    /*
                     * update nbh_perIteration so that the next round lasts
                     * approximately 1 second.
                     */
                    double nbh_perSecond = (1 / ticksPerHash) + 1;
                    if (nbh_perSecond > (double)(4000U<<20)) nbh_perSecond = (double)(4000U<<20);   /* avoid overflow */
                    nbh_perIteration = (XSUM_U32)nbh_perSecond;
                }
                /* g_nbIterations==0 => quick evaluation, no claim of accuracy */
                if (g_nbIterations>0) {
                    iterationNb--;   /* new round for a more accurate speed evaluation */
                    continue;
                }
            }
            if (ticksPerHash < fastestH) fastestH = ticksPerHash;
            if (fastestH>0.) { /* avoid div by zero */
                XSUM_logVerbose(2, "%2u-%-*.*s : %10u -> %8.0f it/s (%7.1f MB/s) \r",
                            iterationNb,
                            HASHNAME_MAX, HASHNAME_MAX, hName,
                            (unsigned)bufferSize,
                            (double)1 / fastestH,
                            ((double)bufferSize / (1 MB)) / fastestH);
        }   }
        {   double nbh_perSecond = (1 / fastestH) + 1;
            if (nbh_perSecond > (double)(4000U<<20)) nbh_perSecond = (double)(4000U<<20);   /* avoid overflow */
            nbh_perIteration = (XSUM_U32)nbh_perSecond;
        }
    }
    XSUM_logVerbose(1, "%2i#%-*.*s : %10u -> %8.0f it/s (%7.1f MB/s) \n",
                    testID,
                    HASHNAME_MAX, HASHNAME_MAX, hName,
                    (unsigned)bufferSize,
                    (double)1 / fastestH,
                    ((double)bufferSize / (1 MB)) / fastestH);
    if (XSUM_logLevel<1)
        XSUM_logVerbose(0, "%u, ", (unsigned)((double)1 / fastestH));
}